

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BenchmarkSuite.hpp
# Opt level: O0

void benchmarks::detail::
     BenchmarksClassRegistrar<benchmarks::MutexBenchmarks,_descriptors::mutex::std::Mutex,_descriptors::mutex::std::RecursiveMutex,_descriptors::mutex::boost::Mutex,_descriptors::mutex::boost::RecursiveMutex>
     ::Register(BenchmarksMap *benchmarks)

{
  pointer this;
  bool bVar1;
  vector<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>
  *this_00;
  reference psVar2;
  element_type *peVar3;
  string local_1b0;
  string local_190;
  string local_160;
  BenchmarkId local_140;
  pair<const_benchmarks::BenchmarkId,_std::shared_ptr<benchmarks::IBenchmark>_> local_e0;
  undefined1 local_70 [8];
  shared_ptr<benchmarks::IBenchmark> b;
  const_iterator __end0;
  const_iterator __begin0;
  vector<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>
  *__range3;
  MutexBenchmarks<descriptors::mutex::std::Mutex> bm;
  BenchmarksMap *benchmarks_local;
  
  bm.super_BenchmarksClass._benchmarks.
  super__Vector_base<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)benchmarks;
  MutexBenchmarks<descriptors::mutex::std::Mutex>::MutexBenchmarks
            ((MutexBenchmarks<descriptors::mutex::std::Mutex> *)&__range3);
  this_00 = BenchmarksClass::GetBenchmarks((BenchmarksClass *)&__range3);
  __end0 = std::
           vector<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>
           ::begin(this_00);
  b.super___shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       vector<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>
       ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_std::shared_ptr<benchmarks::IBenchmark>_*,_std::vector<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>_>
                                *)&b.
                                   super___shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount);
    if (!bVar1) break;
    psVar2 = __gnu_cxx::
             __normal_iterator<const_std::shared_ptr<benchmarks::IBenchmark>_*,_std::vector<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>_>
             ::operator*(&__end0);
    std::shared_ptr<benchmarks::IBenchmark>::shared_ptr
              ((shared_ptr<benchmarks::IBenchmark> *)local_70,psVar2);
    this = bm.super_BenchmarksClass._benchmarks.
           super__Vector_base<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    BenchmarksClass::GetName_abi_cxx11_(&local_160,(BenchmarksClass *)&__range3);
    peVar3 = std::
             __shared_ptr_access<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_70);
    (*peVar3->_vptr_IBenchmark[2])(&local_190);
    descriptors::mutex::std::Mutex::GetName_abi_cxx11_();
    BenchmarkId::BenchmarkId(&local_140,&local_160,&local_190,&local_1b0);
    std::pair<const_benchmarks::BenchmarkId,_std::shared_ptr<benchmarks::IBenchmark>_>::
    pair<benchmarks::BenchmarkId,_std::shared_ptr<benchmarks::IBenchmark>_&,_true>
              (&local_e0,&local_140,(shared_ptr<benchmarks::IBenchmark> *)local_70);
    std::
    map<benchmarks::BenchmarkId,_std::shared_ptr<benchmarks::IBenchmark>,_std::less<benchmarks::BenchmarkId>,_std::allocator<std::pair<const_benchmarks::BenchmarkId,_std::shared_ptr<benchmarks::IBenchmark>_>_>_>
    ::insert((map<benchmarks::BenchmarkId,_std::shared_ptr<benchmarks::IBenchmark>,_std::less<benchmarks::BenchmarkId>,_std::allocator<std::pair<const_benchmarks::BenchmarkId,_std::shared_ptr<benchmarks::IBenchmark>_>_>_>
              *)this,&local_e0);
    std::pair<const_benchmarks::BenchmarkId,_std::shared_ptr<benchmarks::IBenchmark>_>::~pair
              (&local_e0);
    BenchmarkId::~BenchmarkId(&local_140);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_160);
    std::shared_ptr<benchmarks::IBenchmark>::~shared_ptr
              ((shared_ptr<benchmarks::IBenchmark> *)local_70);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<benchmarks::IBenchmark>_*,_std::vector<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>_>
    ::operator++(&__end0);
  }
  BenchmarksClassRegistrar<benchmarks::MutexBenchmarks,_descriptors::mutex::std::RecursiveMutex,_descriptors::mutex::boost::Mutex,_descriptors::mutex::boost::RecursiveMutex>
  ::Register((BenchmarksMap *)
             bm.super_BenchmarksClass._benchmarks.
             super__Vector_base<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  MutexBenchmarks<descriptors::mutex::std::Mutex>::~MutexBenchmarks
            ((MutexBenchmarks<descriptors::mutex::std::Mutex> *)&__range3);
  return;
}

Assistant:

static void Register(BenchmarksMap& benchmarks)
			{
				BenchmarksClass_<ObjectsDescHead_> bm;
				for (auto b : bm.GetBenchmarks())
					benchmarks.insert({BenchmarkId(bm.GetName(), b->GetName(), ObjectsDescHead_::GetName()), b});

				BenchmarksClassRegistrar<BenchmarksClass_, ObjectsDescTail_...>::Register(benchmarks);
			}